

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.cc
# Opt level: O3

BasicImageIO * __thiscall gimage::ImageIO::getBasicImageIO(ImageIO *this,char *name,bool reading)

{
  int iVar1;
  IOException *this_00;
  long *plVar2;
  size_type *psVar3;
  pointer ppBVar4;
  allocator local_81;
  string local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  ppBVar4 = (this->list).
            super__Vector_base<gimage::BasicImageIO_*,_std::allocator<gimage::BasicImageIO_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (ppBVar4 < (this->list).
                super__Vector_base<gimage::BasicImageIO_*,_std::allocator<gimage::BasicImageIO_*>_>.
                _M_impl.super__Vector_impl_data._M_finish) {
    do {
      iVar1 = (*(*ppBVar4)->_vptr_BasicImageIO[3])(*ppBVar4,name,(ulong)reading);
      if ((char)iVar1 != '\0') {
        return *ppBVar4;
      }
      ppBVar4 = ppBVar4 + 1;
    } while (ppBVar4 < (this->list).
                       super__Vector_base<gimage::BasicImageIO_*,_std::allocator<gimage::BasicImageIO_*>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  }
  this_00 = (IOException *)__cxa_allocate_exception(0x28);
  std::__cxx11::string::string((string *)&local_60,name,&local_81);
  std::operator+(&local_40,"Unknown image type (",&local_60);
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_40);
  local_80._M_dataplus._M_p = (pointer)*plVar2;
  psVar3 = (size_type *)(plVar2 + 2);
  if ((size_type *)local_80._M_dataplus._M_p == psVar3) {
    local_80.field_2._M_allocated_capacity = *psVar3;
    local_80.field_2._8_8_ = plVar2[3];
    local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
  }
  else {
    local_80.field_2._M_allocated_capacity = *psVar3;
  }
  local_80._M_string_length = plVar2[1];
  *plVar2 = (long)psVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  gutil::IOException::IOException(this_00,&local_80);
  __cxa_throw(this_00,&gutil::IOException::typeinfo,gutil::Exception::~Exception);
}

Assistant:

const BasicImageIO &ImageIO::getBasicImageIO(const char *name, bool reading) const
{
  for (std::vector<BasicImageIO *>::const_iterator it=list.begin(); it<list.end(); ++it)
  {
    if ((*it)->handlesFile(name, reading))
    {
      return **it;
    }
  }

  throw gutil::IOException("Unknown image type ("+std::string(name)+")");
}